

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

void __thiscall ExecutorX86::ClearNative(ExecutorX86 *this)

{
  int iVar1;
  ulong uVar2;
  ExpiredCodeBlock *pEVar3;
  ExpiredFunctionAddressList *pEVar4;
  uint i;
  uint uVar5;
  TraceScope traceScope;
  
  if (ClearNative()::token == '\0') {
    iVar1 = __cxa_guard_acquire(&ClearNative()::token);
    if (iVar1 != 0) {
      ClearNative::token = NULLC::TraceGetToken("x86","ClearNative");
      __cxa_guard_release(&ClearNative()::token);
    }
  }
  NULLC::TraceScope::TraceScope(&traceScope,ClearNative::token);
  uVar2 = (ulong)(this->instList).count;
  if (uVar2 != 0) {
    NULLC::fillMemory((this->instList).data,0,uVar2 * 0x50);
  }
  *(undefined8 *)&(this->instList).count = 0;
  this->binCodeSize = 0;
  (this->globalCodeRanges).count = 0;
  for (uVar5 = 0; uVar5 < (this->expiredCodeBlocks).count; uVar5 = uVar5 + 1) {
    pEVar3 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                       (&this->expiredCodeBlocks,uVar5);
    NULLC::MemProtect(pEVar3->code,pEVar3->codeSize,3);
    (*(code *)NULLC::dealloc)(pEVar3->code);
  }
  (this->expiredCodeBlocks).count = 0;
  for (uVar5 = 0; uVar5 < (this->expiredFunctionAddressLists).count; uVar5 = uVar5 + 1) {
    pEVar4 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                       (&this->expiredFunctionAddressLists,uVar5);
    (*(code *)NULLC::dealloc)(pEVar4->data);
  }
  (this->expiredFunctionAddressLists).count = 0;
  this->oldJumpTargetCount = 0;
  this->oldRegKillInfoCount = 0;
  this->oldFunctionSize = 0;
  if (this->codeGenCtx != (CodeGenRegVmContext *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  this->codeGenCtx = (CodeGenRegVmContext *)0x0;
  this->codeRunning = false;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return;
}

Assistant:

void ExecutorX86::ClearNative()
{
	TRACE_SCOPE("x86", "ClearNative");

	if (instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();

	binCodeSize = 0;
	lastInstructionCount = 0;

	globalCodeRanges.clear();

	for(unsigned i = 0; i < expiredCodeBlocks.size(); i++)
	{
		ExpiredCodeBlock &block = expiredCodeBlocks[i];

#ifndef __linux
		DWORD unusedProtect;
		VirtualProtect((void*)block.code, block.codeSize, oldCodeBodyProtect, &unusedProtect);
#else
		NULLC::MemProtect((void*)block.code, block.codeSize, PROT_READ | PROT_WRITE);
#endif

		NULLC::dealloc(block.code);

#if defined(_M_X64) && !defined(__linux)
		if(block.unwindTable)
		{
			RtlDeleteFunctionTable(block.unwindTable);
			NULLC::dealloc(block.unwindTable);
		}
#endif
	}

	expiredCodeBlocks.clear();

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		NULLC::dealloc(info.data);
	}
	expiredFunctionAddressLists.clear();

#if defined(_M_X64) && !defined(__linux)
	// Remove function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();
#endif

	oldJumpTargetCount = 0;
	oldRegKillInfoCount = 0;
	oldFunctionSize = 0;

	// Create new code generation context
	if(codeGenCtx)
		NULLC::destruct(codeGenCtx);
	codeGenCtx = NULL;

	codeRunning = false;
}